

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall OpenMD::SimpleTypeData<double>::~SimpleTypeData(SimpleTypeData<double> *this)

{
  void *in_RDI;
  
  ~SimpleTypeData((SimpleTypeData<double> *)0x245af8);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

SimpleTypeData(const std::string& id) :
        GenericData(id), data_(ElemDataType()) {}